

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O3

mkv_timestamp_t MATROSKA_BlockGetFrameEnd(matroska_block *Block,size_t FrameNum)

{
  long lVar1;
  mkv_timestamp_t mVar2;
  long lVar3;
  
  lVar3 = 0x7fffffffffffffff;
  mVar2 = MATROSKA_BlockGetFrameStart(Block,FrameNum);
  if (((mVar2 != 0x7fffffffffffffff) && (FrameNum < (Block->Durations)._Used >> 3)) &&
     (lVar1 = *(long *)((Block->Durations)._Begin + FrameNum * 8), lVar1 != 0x7fffffffffffffff)) {
    lVar3 = lVar1 + mVar2;
  }
  return lVar3;
}

Assistant:

mkv_timestamp_t MATROSKA_BlockGetFrameEnd(const matroska_block *Block, size_t FrameNum)
{
    mkv_timestamp_t Result = MATROSKA_BlockGetFrameStart(Block,FrameNum), a;
    if (Result==INVALID_TIMESTAMP_T)
        return INVALID_TIMESTAMP_T;
    a = MATROSKA_BlockGetFrameDuration(Block,FrameNum);
    if (a==INVALID_TIMESTAMP_T)
        return INVALID_TIMESTAMP_T;
    return Result + a;
}